

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall httplib::Server::bind_internal(Server *this,char *host,int port,int socket_flags)

{
  uint16_t uVar1;
  uint uVar2;
  socket_t __i;
  __int_type_conflict _Var3;
  int iVar4;
  socklen_t local_ac;
  undefined1 local_a8 [4];
  socklen_t len;
  sockaddr_storage address;
  int socket_flags_local;
  int port_local;
  char *host_local;
  Server *this_local;
  
  address.__ss_align._0_4_ = socket_flags;
  address.__ss_align._4_4_ = port;
  uVar2 = (*this->_vptr_Server[2])();
  if ((uVar2 & 1) == 0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    __i = create_server_socket(this,host,address.__ss_align._4_4_,(int)address.__ss_align);
    std::__atomic_base<int>::operator=(&(this->svr_sock_).super___atomic_base<int>,__i);
    _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->svr_sock_);
    if (_Var3 == -1) {
      this_local._4_4_ = 0xffffffff;
    }
    else if (address.__ss_align._4_4_ == 0) {
      local_ac = 0x80;
      _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->svr_sock_);
      iVar4 = getsockname(_Var3,(sockaddr *)local_a8,&local_ac);
      if (iVar4 == -1) {
        this_local._4_4_ = 0xffffffff;
      }
      else if (local_a8._0_2_ == 2) {
        uVar1 = ntohs(local_a8._2_2_);
        this_local._4_4_ = (uint)uVar1;
      }
      else if (local_a8._0_2_ == 10) {
        uVar1 = ntohs(local_a8._2_2_);
        this_local._4_4_ = (uint)uVar1;
      }
      else {
        this_local._4_4_ = 0xffffffff;
      }
    }
    else {
      this_local._4_4_ = address.__ss_align._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

inline int Server::bind_internal(const char *host, int port, int socket_flags) {
  if (!is_valid()) { return -1; }

  svr_sock_ = create_server_socket(host, port, socket_flags);
  if (svr_sock_ == INVALID_SOCKET) { return -1; }

  if (port == 0) {
    struct sockaddr_storage address;
    socklen_t len = sizeof(address);
    if (getsockname(svr_sock_, reinterpret_cast<struct sockaddr *>(&address),
                    &len) == -1) {
      return -1;
    }
    if (address.ss_family == AF_INET) {
      return ntohs(reinterpret_cast<struct sockaddr_in *>(&address)->sin_port);
    } else if (address.ss_family == AF_INET6) {
      return ntohs(
          reinterpret_cast<struct sockaddr_in6 *>(&address)->sin6_port);
    } else {
      return -1;
    }
  } else {
    return port;
  }
}